

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calc.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  Identifier IStack_338;
  Context<char> context;
  
  Centaurus::Context<char>::Context(&context,"../grammars/calc.cgr");
  Centaurus::Identifier::Identifier(&IStack_338,L"INPUT");
  Centaurus::Context<char>::attach(&context,&IStack_338,parse_INPUT);
  Centaurus::Identifier::~Identifier(&IStack_338);
  Centaurus::Identifier::Identifier(&IStack_338,L"EXPR");
  Centaurus::Context<char>::attach(&context,&IStack_338,parse_EXPR);
  Centaurus::Identifier::~Identifier(&IStack_338);
  Centaurus::Identifier::Identifier(&IStack_338,L"TERM");
  Centaurus::Context<char>::attach(&context,&IStack_338,parse_TERM);
  Centaurus::Identifier::~Identifier(&IStack_338);
  Centaurus::Identifier::Identifier(&IStack_338,L"FACT");
  Centaurus::Context<char>::attach(&context,&IStack_338,parse_FACT);
  Centaurus::Identifier::~Identifier(&IStack_338);
  Centaurus::Context<char>::parse(&context,argv[1],1);
  printf("Result = %d\n",(ulong)(uint)result);
  Centaurus::Context<char>::~Context(&context);
  return 0;
}

Assistant:

int main(int argc, const char *argv[])
{
    Context<char> context{"../grammars/calc.cgr"};

    context.attach(L"INPUT", parse_INPUT);
    context.attach(L"EXPR", parse_EXPR);
    context.attach(L"TERM", parse_TERM);
    context.attach(L"FACT", parse_FACT);

    context.parse(argv[1], 1);

    printf("Result = %d\n", result);

    return 0;
}